

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5DecodePoslist(int *pRc,Fts5Buffer *pBuf,u8 *a,int n)

{
  int iVar1;
  uint local_2c;
  int local_28;
  int iVal;
  int iOff;
  int n_local;
  u8 *a_local;
  Fts5Buffer *pBuf_local;
  int *pRc_local;
  
  local_28 = 0;
  iVal = n;
  _iOff = a;
  a_local = (u8 *)pBuf;
  pBuf_local = (Fts5Buffer *)pRc;
  while (local_28 < iVal) {
    iVar1 = sqlite3Fts5GetVarint32(_iOff + local_28,&local_2c);
    local_28 = iVar1 + local_28;
    sqlite3Fts5BufferAppendPrintf((int *)pBuf_local,(Fts5Buffer *)a_local," %d",(ulong)local_2c);
  }
  return local_28;
}

Assistant:

static int fts5DecodePoslist(int *pRc, Fts5Buffer *pBuf, const u8 *a, int n){
  int iOff = 0;
  while( iOff<n ){
    int iVal;
    iOff += fts5GetVarint32(&a[iOff], iVal);
    sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " %d", iVal);
  }
  return iOff;
}